

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O2

void __thiscall AliTcpConnection::Close(AliTcpConnection *this)

{
  if (this->fd_ != 0) {
    close(this->fd_);
  }
  ~AliTcpConnection(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

void AliTcpConnection::Close() {
  if(fd_) {
#ifdef WIN32
    closesocket(fd_);
#else
    ::close(fd_);
#endif
  }

  delete this;
  return;
}